

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int push_captures(MatchState *ms,char *s,char *e)

{
  int local_2c;
  int local_24;
  int nlevels;
  int i;
  char *e_local;
  char *s_local;
  MatchState *ms_local;
  
  if ((ms->level == 0) && (s != (char *)0x0)) {
    local_2c = 1;
  }
  else {
    local_2c = ms->level;
  }
  luaL_checkstack(ms->L,local_2c,"too many captures");
  for (local_24 = 0; local_24 < local_2c; local_24 = local_24 + 1) {
    push_onecapture(ms,local_24,s,e);
  }
  return local_2c;
}

Assistant:

static int push_captures (MatchState *ms, const char *s, const char *e) {
  int i;
  int nlevels = (ms->level == 0 && s) ? 1 : ms->level;
  luaL_checkstack(ms->L, nlevels, "too many captures");
  for (i = 0; i < nlevels; i++)
    push_onecapture(ms, i, s, e);
  return nlevels;  /* number of strings pushed */
}